

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O1

void idwt_sym_stride(double *cA,int len_cA,double *cD,double *lpr,double *hpr,int lpr_len,double *X,
                    int istride,int ostride)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if (0 < len_cA) {
    lVar3 = (long)istride;
    lVar8 = -2;
    lVar4 = -1;
    uVar7 = 0;
    do {
      lVar8 = lVar8 + 2;
      lVar4 = lVar4 + 2;
      lVar9 = lVar8 * ostride;
      lVar5 = lVar4 * ostride;
      X[lVar9] = 0.0;
      X[lVar5] = 0.0;
      if (1 < lpr_len) {
        lVar1 = 8;
        lVar2 = 0;
        lVar6 = 0;
        do {
          if ((uint)((int)uVar7 + (int)lVar6) < (uint)len_cA) {
            X[lVar9] = *(double *)((long)lpr + lVar1 + -8) * *(double *)((long)cA + lVar2) +
                       *(double *)((long)hpr + lVar1 + -8) * *(double *)((long)cD + lVar2) +
                       X[lVar9];
            X[lVar5] = *(double *)((long)lpr + lVar1) * *(double *)((long)cA + lVar2) +
                       *(double *)((long)hpr + lVar1) * *(double *)((long)cD + lVar2) + X[lVar5];
          }
          lVar6 = lVar6 + -1;
          lVar2 = lVar2 + lVar3 * -8;
          lVar1 = lVar1 + 0x10;
        } while (-lVar6 != (ulong)(uint)(lpr_len / 2));
      }
      uVar7 = uVar7 + 1;
      cA = cA + lVar3;
      cD = cD + lVar3;
    } while (uVar7 != (uint)len_cA);
  }
  return;
}

Assistant:

void idwt_sym_stride(double *cA, int len_cA, double *cD, double *lpr, double *hpr, int lpr_len, double *X, int istride, int ostride) {
	int len_avg, i, l, m, n, t, v;
	int ms, ns, is;
	len_avg = lpr_len;
	m = -2;
	n = -1;

	for (v = 0; v < len_cA; ++v) {
		i = v;
		m += 2;
		n += 2;
		ms = m * ostride;
		ns = n * ostride;
		X[ms] = 0.0;
		X[ns] = 0.0;
		for (l = 0; l < len_avg / 2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				is = (i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
		}
	}
}